

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O1

void __thiscall xLearn::AUCMetric::~AUCMetric(AUCMetric *this)

{
  ~AUCMetric(this);
  operator_delete(this);
  return;
}

Assistant:

~AUCMetric() { }